

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblkof.c
# Opt level: O0

void tommy_arrayblkof_init(tommy_arrayblkof *array,tommy_size_t element_size)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_size_t element_size_local;
  tommy_arrayblkof *array_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_array_init(&array->block);
  array->element_size = element_size;
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblkof_init(tommy_arrayblkof* array, tommy_size_t element_size)
{
	tommy_array_init(&array->block);

	array->element_size = element_size;
	array->count = 0;
}